

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O3

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::ConvertToData
          (DictionaryPropertyDescriptor<unsigned_short> *this)

{
  code *pcVar1;
  bool bVar2;
  Flags FVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  
  FVar3 = this->flags;
  if ((FVar3 & IsAccessor) != None) {
    if ((this->Getter == 0xffff) || (this->Setter == 0xffff)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xdc,"(this->Getter != NoSlots && this->Setter != NoSlots)",
                                  "this->Getter != NoSlots && this->Setter != NoSlots");
      if (!bVar2) goto LAB_00da0dff;
      *puVar5 = 0;
      FVar3 = this->flags;
    }
    this->flags = FVar3 & ~IsAccessor;
    if ((FVar3 & IsShadowed) == None) {
      if (this->Data != 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                    ,0xe4,"(this->Data == NoSlots)","this->Data == NoSlots");
        if (!bVar2) goto LAB_00da0dff;
        *puVar5 = 0;
      }
      this->Data = this->Getter;
      this->Getter = 0xffff;
    }
    else if (this->Data == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xe0,"(this->Data != NoSlots)","this->Data != NoSlots");
      if (!bVar2) goto LAB_00da0dff;
      *puVar5 = 0;
    }
  }
  uVar4 = GetDataPropertyIndex<false>(this);
  if (uVar4 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xe9,"(GetDataPropertyIndex<false>() != NoSlots)",
                                "GetDataPropertyIndex<false>() != NoSlots");
    if (!bVar2) {
LAB_00da0dff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::ConvertToData()
    {
        if (GetIsAccessor())
        {
            Assert(this->Getter != NoSlots && this->Setter != NoSlots);
            SetIsAccessor(false);
            if (GetIsShadowed())
            {
                Assert(this->Data != NoSlots);
            }
            else
            {
                Assert(this->Data == NoSlots);
                this->Data = this->Getter;
                this->Getter = NoSlots;
            }
        }
        Assert(GetDataPropertyIndex<false>() != NoSlots);
    }